

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorTorque::ChShaftsMotorTorque
          (ChShaftsMotorTorque *this,ChShaftsMotorTorque *other)

{
  ChShaftsCouple::ChShaftsCouple((ChShaftsCouple *)this);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorTorque_0116f878;
  (this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(other->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

ChShaftsMotorTorque::ChShaftsMotorTorque(const ChShaftsMotorTorque& other) : ChShaftsMotorBase(other) {

    this->f_torque = other.f_torque;
}